

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t process_base_block(archive_read *a,archive_entry *entry)

{
  char cVar1;
  wchar_t wVar2;
  uint8_t *puStack_68;
  wchar_t ret;
  uint8_t *p;
  size_t header_flags;
  size_t header_id;
  size_t hdr_size;
  size_t hdr_size_len;
  size_t raw_hdr_size;
  uint32_t computed_crc;
  uint32_t hdr_crc;
  rar5 *rar;
  size_t SMALLEST_RAR5_BLOCK_SIZE;
  archive_entry *entry_local;
  archive_read *a_local;
  
  rar = (rar5 *)0x3;
  SMALLEST_RAR5_BLOCK_SIZE = (size_t)entry;
  entry_local = (archive_entry *)a;
  _computed_crc = get_context(a);
  hdr_size_len = 0;
  header_flags = 0;
  p = (uint8_t *)0x0;
  a_local._4_4_ = skip_unprocessed_bytes((archive_read *)entry_local);
  if (a_local._4_4_ == L'\0') {
    cVar1 = read_u32((archive_read *)entry_local,(uint32_t *)((long)&raw_hdr_size + 4));
    if (cVar1 == '\0') {
      a_local._4_4_ = L'\x01';
    }
    else {
      wVar2 = read_var_sized((archive_read *)entry_local,&hdr_size_len,&hdr_size);
      if (wVar2 == L'\0') {
        a_local._4_4_ = L'\x01';
      }
      else {
        header_id = hdr_size_len + hdr_size;
        if (header_id < 0x200001) {
          if (((hdr_size_len == 0) || (hdr_size == 0)) || (header_id < 3)) {
            archive_set_error((archive *)entry_local,0x54,"Too small block encountered (%zu bytes)",
                              hdr_size_len);
            a_local._4_4_ = L'\xffffffe2';
          }
          else {
            wVar2 = read_ahead((archive_read *)entry_local,header_id,&stack0xffffffffffffff98);
            if (wVar2 == L'\0') {
              a_local._4_4_ = L'\x01';
            }
            else {
              raw_hdr_size._0_4_ = crc32(0,puStack_68,header_id & 0xffffffff);
              if ((int)raw_hdr_size == raw_hdr_size._4_4_) {
                wVar2 = consume((archive_read *)entry_local,hdr_size);
                if (wVar2 == L'\0') {
                  wVar2 = read_var_sized((archive_read *)entry_local,&header_flags,(size_t *)0x0);
                  if (wVar2 == L'\0') {
                    a_local._4_4_ = L'\x01';
                  }
                  else {
                    wVar2 = read_var_sized((archive_read *)entry_local,(size_t *)&p,(size_t *)0x0);
                    if (wVar2 == L'\0') {
                      a_local._4_4_ = L'\x01';
                    }
                    else {
                      *(byte *)&_computed_crc->generic =
                           *(byte *)&_computed_crc->generic & 0xfe | (byte)(((uint)p & 0x10) >> 4);
                      *(byte *)&_computed_crc->generic =
                           *(byte *)&_computed_crc->generic & 0xfd |
                           (char)(((uint)p & 8) >> 3) * '\x02';
                      (_computed_crc->generic).size = (wchar_t)header_id;
                      (_computed_crc->generic).last_header_id = (wchar_t)header_flags;
                      *(byte *)&_computed_crc->main = *(byte *)&_computed_crc->main & 0xfb;
                      switch(header_flags) {
                      case 0:
                        a_local._4_4_ = L'\x01';
                        break;
                      case 1:
                        a_local._4_4_ =
                             process_head_main((archive_read *)entry_local,_computed_crc,
                                               (archive_entry *)SMALLEST_RAR5_BLOCK_SIZE,(size_t)p);
                        if (a_local._4_4_ == L'\0') {
                          a_local._4_4_ = L'\xfffffff6';
                        }
                        break;
                      case 2:
                        a_local._4_4_ =
                             process_head_file((archive_read *)entry_local,_computed_crc,
                                               (archive_entry *)SMALLEST_RAR5_BLOCK_SIZE,(size_t)p);
                        break;
                      case 3:
                        a_local._4_4_ =
                             process_head_service
                                       ((archive_read *)entry_local,_computed_crc,
                                        (archive_entry *)SMALLEST_RAR5_BLOCK_SIZE,(size_t)p);
                        break;
                      case 4:
                        archive_entry_set_is_metadata_encrypted
                                  ((archive_entry *)SMALLEST_RAR5_BLOCK_SIZE,'\x01');
                        archive_entry_set_is_data_encrypted
                                  ((archive_entry *)SMALLEST_RAR5_BLOCK_SIZE,'\x01');
                        _computed_crc->has_encrypted_entries = L'\x01';
                        _computed_crc->headers_are_encrypted = L'\x01';
                        archive_set_error((archive *)entry_local,0x54,"Encryption is not supported")
                        ;
                        a_local._4_4_ = L'\xffffffe2';
                        break;
                      case 5:
                        *(byte *)&_computed_crc->main = *(byte *)&_computed_crc->main & 0xfb | 4;
                        if ((*(byte *)&_computed_crc->main >> 1 & 1) == 0) {
                          a_local._4_4_ = L'\x01';
                        }
                        else {
                          wVar2 = scan_for_signature((archive_read *)entry_local);
                          if (wVar2 == L'\xffffffe2') {
                            a_local._4_4_ = L'\x01';
                          }
                          else if ((_computed_crc->vol).expected_vol_no == 0xffffffff) {
                            archive_set_error((archive *)entry_local,0x54,"Header error");
                            a_local._4_4_ = L'\xffffffe2';
                          }
                          else {
                            (_computed_crc->vol).expected_vol_no = (_computed_crc->main).vol_no + 1;
                            a_local._4_4_ = L'\0';
                          }
                        }
                        break;
                      default:
                        if (((ulong)p & 4) == 0) {
                          archive_set_error((archive *)entry_local,0x54,"Header type error");
                          a_local._4_4_ = L'\xffffffe2';
                        }
                        else {
                          a_local._4_4_ = L'\xfffffff6';
                        }
                      }
                    }
                  }
                }
                else {
                  a_local._4_4_ = L'\x01';
                }
              }
              else {
                archive_set_error((archive *)entry_local,0x54,"Header CRC error");
                a_local._4_4_ = L'\xffffffe2';
              }
            }
          }
        }
        else {
          archive_set_error((archive *)entry_local,0x54,"Base block header is too large");
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int process_base_block(struct archive_read* a,
    struct archive_entry* entry)
{
	const size_t SMALLEST_RAR5_BLOCK_SIZE = 3;

	struct rar5* rar = get_context(a);
	uint32_t hdr_crc, computed_crc;
	size_t raw_hdr_size = 0, hdr_size_len, hdr_size;
	size_t header_id = 0;
	size_t header_flags = 0;
	const uint8_t* p;
	int ret;

	enum HEADER_TYPE {
		HEAD_MARK    = 0x00, HEAD_MAIN  = 0x01, HEAD_FILE   = 0x02,
		HEAD_SERVICE = 0x03, HEAD_CRYPT = 0x04, HEAD_ENDARC = 0x05,
		HEAD_UNKNOWN = 0xff,
	};

	/* Skip any unprocessed data for this file. */
	ret = skip_unprocessed_bytes(a);
	if(ret != ARCHIVE_OK)
		return ret;

	/* Read the expected CRC32 checksum. */
	if(!read_u32(a, &hdr_crc)) {
		return ARCHIVE_EOF;
	}

	/* Read header size. */
	if(!read_var_sized(a, &raw_hdr_size, &hdr_size_len)) {
		return ARCHIVE_EOF;
	}

	hdr_size = raw_hdr_size + hdr_size_len;

	/* Sanity check, maximum header size for RAR5 is 2MB. */
	if(hdr_size > (2 * 1024 * 1024)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Base block header is too large");

		return ARCHIVE_FATAL;
	}

	/* Additional sanity checks to weed out invalid files. */
	if(raw_hdr_size == 0 || hdr_size_len == 0 ||
		hdr_size < SMALLEST_RAR5_BLOCK_SIZE)
	{
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Too small block encountered (%zu bytes)",
		    raw_hdr_size);

		return ARCHIVE_FATAL;
	}

	/* Read the whole header data into memory, maximum memory use here is
	 * 2MB. */
	if(!read_ahead(a, hdr_size, &p)) {
		return ARCHIVE_EOF;
	}

	/* Verify the CRC32 of the header data. */
	computed_crc = (uint32_t) crc32(0, p, (int) hdr_size);
	if(computed_crc != hdr_crc) {
#ifndef DONT_FAIL_ON_CRC_ERROR
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Header CRC error");

		return ARCHIVE_FATAL;
#endif
	}

	/* If the checksum is OK, we proceed with parsing. */
	if(ARCHIVE_OK != consume(a, hdr_size_len)) {
		return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &header_id, NULL))
		return ARCHIVE_EOF;

	if(!read_var_sized(a, &header_flags, NULL))
		return ARCHIVE_EOF;

	rar->generic.split_after = (header_flags & HFL_SPLIT_AFTER) > 0;
	rar->generic.split_before = (header_flags & HFL_SPLIT_BEFORE) > 0;
	rar->generic.size = (int)hdr_size;
	rar->generic.last_header_id = (int)header_id;
	rar->main.endarc = 0;

	/* Those are possible header ids in RARv5. */
	switch(header_id) {
		case HEAD_MAIN:
			ret = process_head_main(a, rar, entry, header_flags);

			/* Main header doesn't have any files in it, so it's
			 * pointless to return to the caller. Retry to next
			 * header, which should be HEAD_FILE/HEAD_SERVICE. */
			if(ret == ARCHIVE_OK)
				return ARCHIVE_RETRY;

			return ret;
		case HEAD_SERVICE:
			ret = process_head_service(a, rar, entry, header_flags);
			return ret;
		case HEAD_FILE:
			ret = process_head_file(a, rar, entry, header_flags);
			return ret;
		case HEAD_CRYPT:
			archive_entry_set_is_metadata_encrypted(entry, 1);
			archive_entry_set_is_data_encrypted(entry, 1);
			rar->has_encrypted_entries = 1;
			rar->headers_are_encrypted = 1;
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encryption is not supported");
			return ARCHIVE_FATAL;
		case HEAD_ENDARC:
			rar->main.endarc = 1;

			/* After encountering an end of file marker, we need
			 * to take into consideration if this archive is
			 * continued in another file (i.e. is it part01.rar:
			 * is there a part02.rar?) */
			if(rar->main.volume) {
				/* In case there is part02.rar, position the
				 * read pointer in a proper place, so we can
				 * resume parsing. */
				ret = scan_for_signature(a);
				if(ret == ARCHIVE_FATAL) {
					return ARCHIVE_EOF;
				} else {
					if(rar->vol.expected_vol_no ==
					    UINT_MAX) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Header error");
							return ARCHIVE_FATAL;
					}

					rar->vol.expected_vol_no =
					    rar->main.vol_no + 1;
					return ARCHIVE_OK;
				}
			} else {
				return ARCHIVE_EOF;
			}
		case HEAD_MARK:
			return ARCHIVE_EOF;
		default:
			if((header_flags & HFL_SKIP_IF_UNKNOWN) == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Header type error");
				return ARCHIVE_FATAL;
			} else {
				/* If the block is marked as 'skip if unknown',
				 * do as the flag says: skip the block
				 * instead on failing on it. */
				return ARCHIVE_RETRY;
			}
	}

#if !defined WIN32
	// Not reached.
	archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
	    "Internal unpacker error");
	return ARCHIVE_FATAL;
#endif
}